

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O2

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  int *piVar1;
  undefined8 uVar2;
  N_Vector p_Var3;
  N_Vector p_Var4;
  N_Vector p_Var5;
  undefined8 uVar6;
  N_Vector p_Var7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  code *pcVar13;
  code *pcVar14;
  int iVar15;
  int iVar16;
  void *pvVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  double __x;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_e0;
  N_Vector Xv [3];
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  piVar1 = (int *)S->content;
  iVar16 = *piVar1;
  uVar21 = piVar1[1];
  uVar2 = *(undefined8 *)(piVar1 + 0x18);
  p_Var3 = *(N_Vector *)(piVar1 + 0x16);
  p_Var4 = *(N_Vector *)(piVar1 + 0x1a);
  p_Var5 = *(N_Vector *)(piVar1 + 0x1c);
  uVar6 = *(undefined8 *)(piVar1 + 0x1e);
  p_Var7 = *(N_Vector *)(piVar1 + 0x20);
  uVar8 = *(undefined8 *)(piVar1 + 0x22);
  lVar9 = *(long *)(piVar1 + 0x12);
  lVar10 = *(long *)(piVar1 + 0x14);
  uVar11 = *(undefined8 *)(piVar1 + 10);
  uVar12 = *(undefined8 *)(piVar1 + 0x10);
  pcVar13 = *(code **)(piVar1 + 8);
  pcVar14 = *(code **)(piVar1 + 0xe);
  piVar1[3] = 0;
  uVar18 = uVar21 & 0xfffffffe;
  if (uVar18 == 2) {
    if (piVar1[2] == 0) {
      piVar1[6] = -0x270e;
      return -0x270e;
    }
LAB_001014ab:
    N_VScale(0x3ff0000000000000,b,uVar2);
  }
  else {
    if (piVar1[2] != 0) goto LAB_001014ab;
    iVar15 = (*pcVar13)(uVar11,x,uVar2);
    if (iVar15 != 0) {
LAB_00101560:
      piVar1[2] = 0;
      iVar19 = -0x325;
      iVar16 = 0x323;
      goto LAB_00101570;
    }
    N_VLinearSum(0x3ff0000000000000,b,uVar2);
  }
  uVar21 = uVar21 | 2;
  if (uVar21 == 3) {
    iVar15 = (*pcVar14)(delta,uVar12,uVar2,p_Var3,1);
    if (iVar15 == 0) goto LAB_00101526;
LAB_001014fe:
    piVar1[2] = 0;
    iVar19 = -0x328;
    iVar16 = 0x325;
LAB_00101570:
    if (iVar15 < 0) {
      iVar16 = iVar19;
    }
    *(int *)((long)S->content + 0x18) = iVar16;
    return iVar16;
  }
  N_VScale(0x3ff0000000000000,uVar2,p_Var3);
LAB_00101526:
  if (lVar9 == 0) {
    N_VScale(0x3ff0000000000000,p_Var3,uVar2);
  }
  else {
    N_VProd(lVar9,p_Var3,uVar2);
  }
  __x = (double)N_VDotProd(uVar2,uVar2);
  dVar24 = 0.0;
  if (0.0 < __x) {
    if (__x < 0.0) {
      dVar24 = sqrt(__x);
    }
    else {
      dVar24 = SQRT(__x);
    }
  }
  *(double *)(piVar1 + 4) = dVar24;
  if (dVar24 <= delta) {
    piVar1[2] = 0;
    pvVar17 = S->content;
    goto LAB_00101ad3;
  }
  N_VScale(0x3ff0000000000000,uVar2,p_Var3);
  N_VScale(0x3ff0000000000000,uVar2,p_Var4);
  if ((lVar10 != 0) && (piVar1[2] == 0)) {
    N_VProd(lVar10,x);
  }
  iVar20 = 0;
  local_e0 = dVar24;
  iVar19 = 0;
  if (0 < iVar16) {
    iVar19 = iVar16;
  }
  for (; iVar19 != iVar20; iVar20 = iVar20 + 1) {
    piVar1[3] = piVar1[3] + 1;
    if (lVar10 == 0) {
      N_VScale(0x3ff0000000000000,p_Var4,uVar8);
    }
    else {
      N_VDiv(p_Var4,lVar10,uVar8);
    }
    if (uVar18 == 2) {
      N_VScale(0x3ff0000000000000,uVar8,p_Var7);
      iVar15 = (*pcVar14)(delta,uVar12,p_Var7,uVar8,2);
      if (iVar15 != 0) goto LAB_001014fe;
    }
    iVar15 = (*pcVar13)(uVar11,uVar8,p_Var7);
    if (iVar15 != 0) goto LAB_00101560;
    if (uVar21 == 3) {
      iVar15 = (*pcVar14)(delta,uVar12,p_Var7,uVar8,1);
      if (iVar15 != 0) goto LAB_001014fe;
    }
    else {
      N_VScale(0x3ff0000000000000,p_Var7,uVar8);
    }
    if (lVar9 == 0) {
      N_VScale(0x3ff0000000000000,uVar8,p_Var7);
    }
    else {
      N_VProd(lVar9,uVar8,p_Var7);
    }
    local_68 = (double)N_VDotProd(p_Var7,uVar2);
    local_68 = __x / local_68;
    uStack_60 = 0;
    local_48 = -local_68;
    uStack_40 = 0x8000000000000000;
    N_VLinearSum(0x3ff0000000000000,p_Var3,p_Var7,p_Var5);
    if (lVar10 == 0) {
      N_VScale(0x3ff0000000000000,p_Var5,uVar8);
    }
    else {
      N_VDiv(p_Var5,lVar10,uVar8);
    }
    if (uVar18 == 2) {
      N_VScale(0x3ff0000000000000,uVar8,uVar6);
      iVar15 = (*pcVar14)(delta,uVar12,uVar6,uVar8,2);
      if (iVar15 != 0) goto LAB_001014fe;
    }
    iVar15 = (*pcVar13)(uVar11,uVar8,uVar6);
    if (iVar15 != 0) goto LAB_00101560;
    if (uVar21 == 3) {
      iVar15 = (*pcVar14)(delta,uVar12,uVar6,uVar8,1);
      if (iVar15 != 0) goto LAB_001014fe;
    }
    else {
      N_VScale(0x3ff0000000000000,uVar6,uVar8);
    }
    if (lVar9 == 0) {
      N_VScale(0x3ff0000000000000,uVar8,uVar6);
    }
    else {
      N_VProd(lVar9,uVar8,uVar6);
    }
    dVar22 = (double)N_VDotProd(uVar6,uVar6);
    dVar23 = (double)N_VDotProd(uVar6,p_Var5);
    dVar23 = dVar23 / (double)(~-(ulong)(dVar22 == 0.0) & (ulong)dVar22 |
                              -(ulong)(dVar22 == 0.0) & 0x3ff0000000000000);
    if ((iVar20 == 0) && (piVar1[2] != 0)) {
      N_VLinearSum(local_68,p_Var4,p_Var5,x);
    }
    else {
      local_88 = 1.0;
      dStack_80 = local_68;
      Xv[0] = x;
      Xv[1] = p_Var4;
      Xv[2] = p_Var5;
      local_78 = dVar23;
      N_VLinearCombination(3,&local_88,Xv);
    }
    N_VLinearSum(0x3ff0000000000000,p_Var5,uVar6,p_Var3);
    dVar22 = (double)N_VDotProd(p_Var3,p_Var3);
    local_e0 = 0.0;
    if (0.0 < dVar22) {
      local_e0 = (double)N_VDotProd(p_Var3,p_Var3);
      if (local_e0 < 0.0) {
        local_e0 = sqrt(local_e0);
      }
      else {
        local_e0 = SQRT(local_e0);
      }
    }
    *(double *)(piVar1 + 4) = local_e0;
    if (local_e0 <= delta) goto LAB_00101b1c;
    local_50 = (double)N_VDotProd(p_Var3,uVar2);
    local_88 = (local_68 / dVar23) * (local_50 / __x);
    dStack_80 = local_48 * (local_50 / __x);
    local_78 = 1.0;
    Xv[0] = p_Var4;
    Xv[1] = p_Var7;
    Xv[2] = p_Var3;
    N_VLinearCombination(3,&local_88,Xv,p_Var4);
    __x = local_50;
  }
  if (dVar24 <= local_e0) {
    piVar1[2] = 0;
    *(undefined4 *)((long)S->content + 0x18) = 0x322;
    return 0x322;
  }
LAB_00101b1c:
  if (lVar10 != 0) {
    N_VDiv(x,lVar10,x);
  }
  if (uVar18 == 2) {
    iVar15 = (*pcVar14)(delta,uVar12,x,uVar8,2);
    if (iVar15 != 0) goto LAB_001014fe;
    N_VScale(0x3ff0000000000000,uVar8,x);
  }
  piVar1[2] = 0;
  pvVar17 = S->content;
  if (iVar16 <= iVar20) {
    *(undefined4 *)((long)pvVar17 + 0x18) = 0x321;
    return 0x321;
  }
LAB_00101ad3:
  *(undefined4 *)((long)pvVar17 + 0x18) = 0;
  return 0;
}

Assistant:

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                          N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  sunrealtype alpha, beta, omega, omega_denom, beta_num, beta_denom, r_norm, rho;
  N_Vector r_star, r, p, q, u, Ap, vtemp;
  sunbooleantype preOnLeft, preOnRight, scale_x, scale_b, converged;
  sunbooleantype* zeroguess;
  int l, l_max;
  void *A_data, *P_data;
  N_Vector sx, sb;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* res_norm;
  int* nli;
  int status;

  /* local variables for fused vector operations */
  sunrealtype cv[3];
  N_Vector Xv[3];

  /* Make local shortcuts to solver variables. */
  l_max     = SPBCGS_CONTENT(S)->maxl;
  r_star    = SPBCGS_CONTENT(S)->r_star;
  r         = SPBCGS_CONTENT(S)->r;
  p         = SPBCGS_CONTENT(S)->p;
  q         = SPBCGS_CONTENT(S)->q;
  u         = SPBCGS_CONTENT(S)->u;
  Ap        = SPBCGS_CONTENT(S)->Ap;
  vtemp     = SPBCGS_CONTENT(S)->vtemp;
  sb        = SPBCGS_CONTENT(S)->s1;
  sx        = SPBCGS_CONTENT(S)->s2;
  A_data    = SPBCGS_CONTENT(S)->ATData;
  P_data    = SPBCGS_CONTENT(S)->PData;
  atimes    = SPBCGS_CONTENT(S)->ATimes;
  psolve    = SPBCGS_CONTENT(S)->Psolve;
  zeroguess = &(SPBCGS_CONTENT(S)->zeroguess);
  nli       = &(SPBCGS_CONTENT(S)->numiters);
  res_norm  = &(SPBCGS_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* set sunbooleantype flags for internal solver options */
  preOnLeft = ((PRETYPE(S) == SUN_PREC_LEFT) || (PRETYPE(S) == SUN_PREC_BOTH));
  preOnRight = ((PRETYPE(S) == SUN_PREC_RIGHT) || (PRETYPE(S) == SUN_PREC_BOTH));
  scale_x = (sx != NULL);
  scale_b = (sb != NULL);

  SUNLogInfo(S->sunctx->logger, "linear-solver", "solver = spbcgs");

  SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

  /* Check for unsupported use case */
  if (preOnRight && !(*zeroguess))
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_ERR_ARG_INCOMPATIBLE;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed unsupported configuration");

    return SUN_ERR_ARG_INCOMPATIBLE;
  }

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set r_star to initial (unscaled) residual r_0 = b - A*x_0 */

  if (*zeroguess)
  {
    N_VScale(ONE, b, r_star);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, r_star);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
    SUNCheckLastErr();
  }

  /* Apply left preconditioner and b-scaling to r_star = r_0 */

  if (preOnLeft)
  {
    status = psolve(P_data, r_star, r, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed preconditioner solve, retval = %d", status);

      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, r_star, r);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, r, r_star);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, r, r_star);
    SUNCheckLastErr();
  }

  /* Initialize beta_denom to the dot product of r0 with r0 */

  beta_denom = N_VDotProd(r_star, r_star);
  SUNCheckLastErr();

  /* Set r_norm to L2 norm of r_star = sb P1_inv r_0, and
     return if small */

  *res_norm = r_norm = rho = SUNRsqrt(beta_denom);

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "cur-iter = 0, res-norm = %.16g, status = success", *res_norm);

    return (LASTFLAG(S));
  }

  SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
             "cur-iter = 0, res-norm = %.16g, status = continue", *res_norm);

  /* Copy r_star to r and p */

  N_VScale(ONE, r_star, r);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, p);
  SUNCheckLastErr();

  /* Set x = sx x if non-zero guess */
  if (scale_x && !(*zeroguess))
  {
    N_VProd(sx, x, x);
    SUNCheckLastErr();
  }

  /* Begin main iteration loop */

  for (l = 0; l < l_max; l++)
  {
    SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

    (*nli)++;

    /* Generate Ap = A-tilde p, where A-tilde = sb P1_inv A P2_inv sx_inv */

    /*   Apply x-scaling: vtemp = sx_inv p */

    if (scale_x)
    {
      N_VDiv(p, sx, vtemp);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, p, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv p */

    if (preOnRight)
    {
      N_VScale(ONE, vtemp, Ap);
      SUNCheckLastErr();
      status = psolve(P_data, Ap, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }

    /*   Apply A: Ap = A P2_inv sx_inv p */

    status = atimes(A_data, vtemp, Ap);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = ", status);

      return (LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft)
    {
      status = psolve(P_data, Ap, vtemp, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, Ap, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply b-scaling: Ap = sb P1_inv A P2_inv sx_inv p */

    if (scale_b)
    {
      N_VProd(sb, vtemp, Ap);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp, Ap);
      SUNCheckLastErr();
    }

    /* Calculate alpha = <r,r_star>/<Ap,r_star> */

    alpha = N_VDotProd(Ap, r_star);
    SUNCheckLastErr();
    alpha = beta_denom / alpha;

    /* Update q = r - alpha*Ap = r - alpha*(sb P1_inv A P2_inv sx_inv p) */

    N_VLinearSum(ONE, r, -alpha, Ap, q);
    SUNCheckLastErr();

    /* Generate u = A-tilde q */

    /*   Apply x-scaling: vtemp = sx_inv q */

    if (scale_x)
    {
      N_VDiv(q, sx, vtemp);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, q, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv q */

    if (preOnRight)
    {
      N_VScale(ONE, vtemp, u);
      SUNCheckLastErr();
      status = psolve(P_data, u, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }

    /*   Apply A: u = A P2_inv sx_inv u */

    status = atimes(A_data, vtemp, u);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft)
    {
      status = psolve(P_data, u, vtemp, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, u, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply b-scaling: u = sb P1_inv A P2_inv sx_inv u */

    if (scale_b)
    {
      N_VProd(sb, vtemp, u);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp, u);
      SUNCheckLastErr();
    }

    /* Calculate omega = <u,q>/<u,u> */

    omega_denom = N_VDotProd(u, u);
    SUNCheckLastErr();
    if (omega_denom == ZERO) { omega_denom = ONE; }
    omega = N_VDotProd(u, q);
    SUNCheckLastErr();
    omega /= omega_denom;

    /* Update x = x + alpha*p + omega*q */
    if (l == 0 && *zeroguess)
    {
      N_VLinearSum(alpha, p, omega, q, x);
      SUNCheckLastErr();
    }
    else
    {
      cv[0] = ONE;
      Xv[0] = x;

      cv[1] = alpha;
      Xv[1] = p;

      cv[2] = omega;
      Xv[2] = q;

      SUNCheckCall(N_VLinearCombination(3, cv, Xv, x));
    }

    /* Update the residual r = q - omega*u */

    N_VLinearSum(ONE, q, -omega, u, r);
    SUNCheckLastErr();

    /* Set rho = norm(r) and check convergence */

    *res_norm = rho = SUNRsqrt(N_VDotProd(r, r));
    SUNCheckLastErr();

    SUNLogInfo(S->sunctx->logger, "linear-iterate",
               "cur-iter = %i, res-norm = %.16g", *nli, *res_norm);

    if (rho <= delta)
    {
      converged = SUNTRUE;
      break;
    }

    /* Not yet converged, continue iteration */
    /* Update beta = <rnew,r_star> / <rold,r_start> * alpha / omega */

    beta_num = N_VDotProd(r, r_star);
    SUNCheckLastErr();
    beta = ((beta_num / beta_denom) * (alpha / omega));

    /* Update p = r + beta*(p - omega*Ap) = beta*p - beta*omega*Ap + r */
    cv[0] = beta;
    Xv[0] = p;

    cv[1] = -alpha * (beta_num / beta_denom);
    Xv[1] = Ap;

    cv[2] = ONE;
    Xv[2] = r;

    SUNCheckCall(N_VLinearCombination(3, cv, Xv, p));

    /* update beta_denom for next iteration */
    beta_denom = beta_num;

    SUNLogInfoIf(l < l_max - 1, S->sunctx->logger, "end-linear-iterate",
                 "status = continue");
  }

  /* Main loop finished */

  if ((converged == SUNTRUE) || (rho < r_norm))
  {
    /* Apply the x-scaling and right preconditioner: x = P2_inv sx_inv x */

    if (scale_x)
    {
      N_VDiv(x, sx, x);
      SUNCheckLastErr();
    }
    if (preOnRight)
    {
      status = psolve(P_data, x, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
      N_VScale(ONE, vtemp, x);
      SUNCheckLastErr();
    }

    *zeroguess = SUNFALSE;
    if (converged == SUNTRUE)
    {
      SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = success");

      LASTFLAG(S) = SUN_SUCCESS;
    }
    else
    {
      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed residual reduced");

      LASTFLAG(S) = SUNLS_RES_REDUCED;
    }
    return (LASTFLAG(S));
  }
  else
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_CONV_FAIL;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed max iterations");

    return (LASTFLAG(S));
  }
}